

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ListSortFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffff714;
  undefined4 in_stack_fffffffffffff71c;
  FunctionNullHandling in_stack_fffffffffffff728;
  allocator_type local_8d1;
  bind_lambda_function_t in_stack_fffffffffffff730;
  scalar_function_t local_8b8;
  scalar_function_t local_898;
  scalar_function_t local_878;
  LogicalType local_858;
  LogicalType local_840 [4];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7e0;
  LogicalType local_7c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7b0;
  LogicalType local_798;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_780;
  LogicalType local_768;
  LogicalType local_750;
  LogicalType local_738;
  ScalarFunction sort_orders;
  ScalarFunction sort_order;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction sort;
  
  LogicalType::LogicalType((LogicalType *)&sort_orders,ANY);
  LogicalType::LIST((LogicalType *)&sort_order,(LogicalType *)&sort_orders);
  __l._M_len = 1;
  __l._M_array = (iterator)&sort_order;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_780,__l,(allocator_type *)&stack0xfffffffffffff730);
  LogicalType::LogicalType(local_840,ANY);
  LogicalType::LIST(&local_798,local_840);
  local_878.super__Function_base._M_functor._8_8_ = 0;
  local_878.super__Function_base._M_functor._M_unused._M_object = ListSortFunction;
  local_878._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_878.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_738,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_738;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff714;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff71c;
  ScalarFunction::ScalarFunction
            (&sort,(vector<duckdb::LogicalType,_true> *)&local_780,&local_798,&local_878,
             ListNormalSortBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffff728,
             in_stack_fffffffffffff730);
  LogicalType::~LogicalType(&local_738);
  ::std::_Function_base::~_Function_base(&local_878.super__Function_base);
  LogicalType::~LogicalType(&local_798);
  LogicalType::~LogicalType(local_840);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_780);
  LogicalType::~LogicalType((LogicalType *)&sort_order);
  LogicalType::~LogicalType((LogicalType *)&sort_orders);
  LogicalType::LogicalType(local_840,ANY);
  LogicalType::LIST((LogicalType *)&sort_orders,local_840);
  LogicalType::LogicalType
            ((LogicalType *)
             &sort_orders.super_BaseScalarFunction.super_SimpleFunction.super_Function.name.field_2,
             VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&sort_orders;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7b0,__l_00,(allocator_type *)&local_858);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff730,ANY);
  LogicalType::LIST(&local_7c8,(LogicalType *)&stack0xfffffffffffff730);
  local_898.super__Function_base._M_functor._8_8_ = 0;
  local_898.super__Function_base._M_functor._M_unused._M_object = ListSortFunction;
  local_898._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_898.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_750,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_750;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff714;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff71c;
  ScalarFunction::ScalarFunction
            (&sort_order,(vector<duckdb::LogicalType,_true> *)&local_7b0,&local_7c8,&local_898,
             ListNormalSortBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffff728,
             in_stack_fffffffffffff730);
  LogicalType::~LogicalType(&local_750);
  ::std::_Function_base::~_Function_base(&local_898.super__Function_base);
  LogicalType::~LogicalType(&local_7c8);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff730);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7b0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType
              ((LogicalType *)
               ((long)&sort_orders.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                       _vptr_Function + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(local_840);
  LogicalType::LogicalType((LogicalType *)&stack0xfffffffffffff730,ANY);
  LogicalType::LIST(local_840,(LogicalType *)&stack0xfffffffffffff730);
  LogicalType::LogicalType(local_840 + 1,VARCHAR);
  LogicalType::LogicalType(local_840 + 2,VARCHAR);
  __l_01._M_len = 3;
  __l_01._M_array = local_840;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7e0,__l_01,&local_8d1);
  LogicalType::LogicalType(&local_858,ANY);
  LogicalType::LIST(local_840 + 3,&local_858);
  local_8b8.super__Function_base._M_functor._8_8_ = 0;
  local_8b8.super__Function_base._M_functor._M_unused._M_object = ListSortFunction;
  local_8b8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_8b8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_768,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_768;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff714;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff71c;
  ScalarFunction::ScalarFunction
            (&sort_orders,(vector<duckdb::LogicalType,_true> *)&local_7e0,local_840 + 3,&local_8b8,
             ListNormalSortBind,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs_01,CONSISTENT,in_stack_fffffffffffff728,
             in_stack_fffffffffffff730);
  LogicalType::~LogicalType(&local_768);
  ::std::_Function_base::~_Function_base(&local_8b8.super__Function_base);
  LogicalType::~LogicalType(local_840 + 3);
  LogicalType::~LogicalType(&local_858);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7e0);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_840[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType((LogicalType *)&stack0xfffffffffffff730);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  ScalarFunction::ScalarFunction(&local_280,&sort);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  ScalarFunction::~ScalarFunction(&local_280);
  ScalarFunction::ScalarFunction(&local_3a8,&sort_order);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  ScalarFunction::ScalarFunction(&local_4d0,&sort_orders);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  ScalarFunction::~ScalarFunction(&sort_orders);
  ScalarFunction::~ScalarFunction(&sort_order);
  ScalarFunction::~ScalarFunction(&sort);
  return in_RDI;
}

Assistant:

ScalarFunctionSet ListSortFun::GetFunctions() {
	// one parameter: list
	ScalarFunction sort({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY), ListSortFunction,
	                    ListNormalSortBind);

	// two parameters: list, order
	ScalarFunction sort_order({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR},
	                          LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	// three parameters: list, order, null order
	ScalarFunction sort_orders({LogicalType::LIST(LogicalType::ANY), LogicalType::VARCHAR, LogicalType::VARCHAR},
	                           LogicalType::LIST(LogicalType::ANY), ListSortFunction, ListNormalSortBind);

	ScalarFunctionSet list_sort;
	list_sort.AddFunction(sort);
	list_sort.AddFunction(sort_order);
	list_sort.AddFunction(sort_orders);
	return list_sort;
}